

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int INT_EVtransfer_events(CManager_conflict cm,EVstone src_stone_id,EVstone dest_stone_id)

{
  stone_type to_dequeue;
  stone_type p_Var1;
  event_item *peVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  event_path_data in_RDI;
  queue_item *next;
  event_item *event;
  queue_item *item;
  int count;
  stone_type dest_stone;
  stone_type src_stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffa8;
  CManager_conflict event_00;
  CManager_conflict cm_00;
  int local_34;
  stone_type stone;
  int local_4;
  
  stone = (stone_type)in_RDI[1].fmc;
  local_34 = 0;
  to_dequeue = stone_struct(in_stack_ffffffffffffffa8,0);
  if (to_dequeue == (stone_type)0x0) {
    local_4 = -1;
  }
  else {
    p_Var1 = stone_struct(in_stack_ffffffffffffffa8,0);
    if (p_Var1 == (stone_type)0x0) {
      local_4 = -1;
    }
    else {
      cm_00 = (CManager_conflict)to_dequeue->queue->queue_head;
      while (cm_00 != (CManager_conflict)0x0) {
        event_00 = (CManager_conflict)cm_00->control_module_choice;
        peVar2 = dequeue_item((CManager_conflict)CONCAT44(in_ESI,in_EDX),stone,
                              (queue_item *)to_dequeue);
        internal_path_submit(cm_00,(int)((ulong)peVar2 >> 0x20),(event_item *)event_00);
        return_event(in_RDI,(event_item *)CONCAT44(in_ESI,in_EDX));
        local_34 = local_34 + 1;
        cm_00 = event_00;
      }
      local_4 = local_34;
    }
  }
  return local_4;
}

Assistant:

extern int
INT_EVtransfer_events(CManager cm, EVstone src_stone_id, EVstone dest_stone_id)
{
    event_path_data evp = cm->evp;
    stone_type src_stone, dest_stone;
    int count = 0;
    queue_item * item;
    event_item * event;

    src_stone = stone_struct(evp, src_stone_id);
    if (!src_stone) return -1;
    dest_stone = stone_struct(evp, dest_stone_id);
    if (!dest_stone) return -1;
    item = src_stone->queue->queue_head;
    while (item != NULL) {
	queue_item *next = item->next;
	event = dequeue_item(cm, src_stone, item);
	internal_path_submit(cm, dest_stone_id, event);
	return_event(evp, event);
	count++;
	item = next;
    }
    return count;
}